

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void notifier(EventCount *eventCount)

{
  ostream *poVar1;
  int i;
  int local_c;
  
  for (local_c = 0; local_c < 100; local_c = local_c + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Notifying: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    EventCount::notify((EventCount *)0x104ae4);
    poVar1 = std::operator<<((ostream *)&std::cout,"Notified: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    usleep(100);
  }
  return;
}

Assistant:

void notifier(EventCount *eventCount) {
    for (int i = 0; i < 100; i++) {
        std::cout << "Notifying: " << i << std::endl;
        eventCount->notify();
        std::cout << "Notified: " << i << std::endl;
        usleep(100);
    }
}